

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::blockMemberExtensionCheck
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,int member,TString *memberName)

{
  TSymbolTable *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  TString *name;
  TSymbol *pTVar5;
  undefined4 extraout_var_02;
  undefined8 uVar6;
  _func_int **pp_Var7;
  undefined4 extraout_var_01;
  
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])(base);
  pp_Var7 = (base->super_TIntermNode)._vptr_TIntermNode;
  if (CONCAT44(extraout_var,iVar2) == 0) {
    pp_Var7 = pp_Var7 + 0x18;
  }
  else {
    iVar2 = (*pp_Var7[0x14])(base);
    base = (TIntermTyped *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 400))
                     ((long *)CONCAT44(extraout_var_00,iVar2));
    pp_Var7 = (base->super_TIntermNode)._vptr_TIntermNode + 0xc;
  }
  iVar2 = (**pp_Var7)(base);
  plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
  if (plVar4 != (long *)0x0) {
    this_00 = (this->super_TParseContextBase).symbolTable;
    name = (TString *)(**(code **)(*plVar4 + 400))(plVar4);
    pTVar5 = TSymbolTable::find(this_00,name,(bool *)0x0,(bool *)0x0,(int *)0x0);
    if (pTVar5 != (TSymbol *)0x0) {
      iVar2 = (*pTVar5->_vptr_TSymbol[10])(pTVar5);
      plVar4 = (long *)CONCAT44(extraout_var_02,iVar2);
      if (plVar4 != (long *)0x0) {
        cVar1 = (**(code **)(*plVar4 + 0xf8))(plVar4);
        if (cVar1 != '\0') {
          iVar2 = (**(code **)(*plVar4 + 0x100))(plVar4,member);
          if (0 < iVar2) {
            uVar3 = (**(code **)(*plVar4 + 0x100))(plVar4,member);
            uVar6 = (**(code **)(*plVar4 + 0x108))(plVar4,member);
            UNRECOVERED_JUMPTABLE =
                 (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5];
            (*UNRECOVERED_JUMPTABLE)
                      (this,loc,(ulong)uVar3,uVar6,(memberName->_M_dataplus)._M_p,
                       UNRECOVERED_JUMPTABLE);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::blockMemberExtensionCheck(const TSourceLoc& loc, const TIntermTyped* base, int member, const TString& memberName)
{
    // a block that needs extension checking is either 'base', or if arrayed,
    // one level removed to the left
    const TIntermSymbol* baseSymbol = nullptr;
    if (base->getAsBinaryNode() == nullptr)
        baseSymbol = base->getAsSymbolNode();
    else
        baseSymbol = base->getAsBinaryNode()->getLeft()->getAsSymbolNode();
    if (baseSymbol == nullptr)
        return;
    const TSymbol* symbol = symbolTable.find(baseSymbol->getName());
    if (symbol == nullptr)
        return;
    const TVariable* variable = symbol->getAsVariable();
    if (variable == nullptr)
        return;
    if (!variable->hasMemberExtensions())
        return;

    // We now have a variable that is the base of a dot reference
    // with members that need extension checking.
    if (variable->getNumMemberExtensions(member) > 0)
        requireExtensions(loc, variable->getNumMemberExtensions(member), variable->getMemberExtensions(member), memberName.c_str());
}